

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O3

bool __thiscall
glsl_type::can_implicitly_convert_to
          (glsl_type *this,glsl_type *desired,_mesa_glsl_parse_state *state)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  
  if (this == desired) {
    return true;
  }
  if (state == (_mesa_glsl_parse_state *)0x0) {
    if (1 < this->matrix_columns) {
      return false;
    }
  }
  else {
    if (state->EXT_shader_implicit_conversions_enable == false) {
      uVar3 = state->forced_language_version;
      if (uVar3 == 0) {
        uVar3 = state->language_version;
      }
      bVar2 = uVar3 < 0x78 | state->es_shader;
    }
    else {
      bVar2 = 0;
    }
    if (bVar2 != 0) {
      return false;
    }
    if (1 < this->matrix_columns) {
      return false;
    }
  }
  if (1 < desired->matrix_columns) {
    return false;
  }
  if (this->vector_elements != desired->vector_elements) {
    return false;
  }
  cVar1 = desired->field_0x4;
  if ((cVar1 == '\x02') && ((this->field_0x4 & 0xfe) == 0)) {
    return true;
  }
  if ((((state == (_mesa_glsl_parse_state *)0x0) || (state->ARB_gpu_shader5_enable != false)) ||
      (state->MESA_shader_integer_functions_enable != false)) ||
     (state->EXT_shader_implicit_conversions_enable != false)) {
LAB_001877ee:
    if ((cVar1 == '\0') && (this->field_0x4 == '\x01')) {
      return true;
    }
    if (state != (_mesa_glsl_parse_state *)0x0) goto LAB_00187800;
  }
  else {
    uVar3 = state->forced_language_version;
    if (uVar3 == 0) {
      uVar3 = state->language_version;
    }
    if ((399 < uVar3) && (state->es_shader == false)) goto LAB_001877ee;
LAB_00187800:
    if (state->ARB_gpu_shader_fp64_enable == false) {
      uVar3 = state->forced_language_version;
      if (uVar3 == 0) {
        uVar3 = state->language_version;
      }
      if (((399 < uVar3) && (state->es_shader == false)) && (this->field_0x4 == '\x04')) {
        return false;
      }
      uVar3 = state->forced_language_version;
      if (uVar3 == 0) {
        uVar3 = state->language_version;
      }
      if (cVar1 != '\x04') {
        return false;
      }
      if (uVar3 < 400) {
        return false;
      }
      if (state->es_shader != false) {
        return false;
      }
      goto LAB_00187863;
    }
  }
  if (this->field_0x4 == '\x04') {
    return false;
  }
  if (cVar1 != '\x04') {
    return false;
  }
LAB_00187863:
  if ((*(uint *)&this->field_0x4 & 0xfe) == 0 || (char)*(uint *)&this->field_0x4 == '\x02') {
    return true;
  }
  return false;
}

Assistant:

bool
glsl_type::can_implicitly_convert_to(const glsl_type *desired,
                                     _mesa_glsl_parse_state *state) const
{
   if (this == desired)
      return true;

   /* GLSL 1.10 and ESSL do not allow implicit conversions. If there is no
    * state, we're doing intra-stage function linking where these checks have
    * already been done.
    */
   if (state && !state->has_implicit_conversions())
      return false;

   /* There is no conversion among matrix types. */
   if (this->matrix_columns > 1 || desired->matrix_columns > 1)
      return false;

   /* Vector size must match. */
   if (this->vector_elements != desired->vector_elements)
      return false;

   /* int and uint can be converted to float. */
   if (desired->is_float() && this->is_integer_32())
      return true;

   /* With GLSL 4.0, ARB_gpu_shader5, or MESA_shader_integer_functions, int
    * can be converted to uint.  Note that state may be NULL here, when
    * resolving function calls in the linker. By this time, all the
    * state-dependent checks have already happened though, so allow anything
    * that's allowed in any shader version.
    */
   if ((!state || state->has_implicit_uint_to_int_conversion()) &&
         desired->base_type == GLSL_TYPE_UINT && this->base_type == GLSL_TYPE_INT)
      return true;

   /* No implicit conversions from double. */
   if ((!state || state->has_double()) && this->is_double())
      return false;

   /* Conversions from different types to double. */
   if ((!state || state->has_double()) && desired->is_double()) {
      if (this->is_float())
         return true;
      if (this->is_integer_32())
         return true;
   }

   return false;
}